

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pololu.cpp
# Opt level: O2

int showgetposition_setposition_Pololu
              (int *showgetposition,int *setposition,BOOL *bConnected,int threadperiod,
              POLOLU *pololu,int deviceid)

{
  int iVar1;
  uint channel;
  int ivalue;
  long local_38;
  
  ivalue = 0;
  local_38 = (long)deviceid;
  if ((uint)*showgetposition < 0x18) {
    iVar1 = GetValuePololu(pololu,*showgetposition,&ivalue);
    if (iVar1 != 0) goto LAB_0013e3eb;
    mSleep(10);
    printf("%d\n",(ulong)(uint)ivalue);
    pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
    ShowGetPositionMaestroPololu[local_38] = -1;
    pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
    *showgetposition = -1;
  }
  channel = *setposition % 100;
  if (0x17 < channel) {
    return 0;
  }
  iVar1 = SetPWMPololu(pololu,channel,*setposition / 100);
  if (iVar1 == 0) {
    mSleep(10);
    pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
    SetPositionMaestroPololu[local_38] = -1;
    pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
    *setposition = -1;
    return 0;
  }
LAB_0013e3eb:
  puts("Connection to a Pololu lost.");
  *bConnected = 0;
  DisconnectPololu(pololu);
  mSleep((long)threadperiod);
  return 1;
}

Assistant:

int showgetposition_setposition_Pololu(int& showgetposition, int& setposition, BOOL& bConnected, int threadperiod, POLOLU& pololu, int deviceid)
{
	int ivalue = 0;

	if ((showgetposition >= 0)&&(showgetposition < NB_CHANNELS_PWM_POLOLU))
	{
		if (GetValuePololu(&pololu, showgetposition, &ivalue) != EXIT_SUCCESS)
		{
			printf("Connection to a Pololu lost.\n");
			bConnected = FALSE;
			DisconnectPololu(&pololu);
			mSleep(threadperiod);
			return EXIT_FAILURE;
		}
		mSleep(10);
		printf("%d\n", ivalue);
		EnterCriticalSection(&StateVariablesCS);
		ShowGetPositionMaestroPololu[deviceid] = -1;
		LeaveCriticalSection(&StateVariablesCS);
		showgetposition = -1;
	}
	if (((setposition%100) >= 0)&&((setposition%100) < NB_CHANNELS_PWM_POLOLU))
	{
		if (SetPWMPololu(&pololu, (setposition%100), (setposition/100)) != EXIT_SUCCESS)
		{
			printf("Connection to a Pololu lost.\n");
			bConnected = FALSE;
			DisconnectPololu(&pololu);
			mSleep(threadperiod);
			return EXIT_FAILURE;
		}
		mSleep(10);
		EnterCriticalSection(&StateVariablesCS);
		SetPositionMaestroPololu[deviceid] = -1;
		LeaveCriticalSection(&StateVariablesCS);
		setposition = -1;
	}

	return EXIT_SUCCESS;
}